

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcb_openssl.cpp
# Opt level: O2

void __thiscall MCrypto::Backend::Backend(Backend *this,AES_TYPE bits,MODE mode)

{
  InternalData *this_00;
  char *pcVar1;
  QByteArray *a1;
  QArrayDataPointer<char> QStack_b8;
  QArrayDataPointer<char> local_a0;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char> local_70;
  QArrayDataPointer<char> local_58;
  QMetaEnum local_40;
  QMetaEnum local_30;
  
  this_00 = (InternalData *)operator_new(0x70);
  InternalData::InternalData(this_00);
  this->m = this_00;
  local_30 = QMetaEnum::fromType<MCrypto::AES_TYPE>();
  pcVar1 = (char *)QMetaEnum::valueToKey((int)&local_30);
  QByteArray::QByteArray((QByteArray *)&local_70,pcVar1,-1);
  a1 = (QByteArray *)QByteArray::replace((char)&local_70,'_');
  QByteArray::QByteArray((QByteArray *)&local_a0,"-",-1);
  operator+((QByteArray *)&local_88,a1,(QByteArray *)&local_a0);
  local_40 = QMetaEnum::fromType<MCrypto::MODE>();
  pcVar1 = (char *)QMetaEnum::valueToKey((int)&local_40);
  QByteArray::QByteArray((QByteArray *)&QStack_b8,pcVar1,-1);
  operator+((QByteArray *)&local_58,(QByteArray *)&local_88,(QByteArray *)&QStack_b8);
  QByteArray::operator=(&this->m->algorithm,(QByteArray *)&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_b8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
  return;
}

Assistant:

MCrypto::Backend::Backend(MCrypto::AES_TYPE bits, MCrypto::MODE mode)
{
    m = new InternalData;
    m->algorithm = QByteArray(QMetaEnum::fromType<MCrypto::AES_TYPE>()
                                 .valueToKey(int(bits))).replace('_', '-')
                  + QByteArray("-")
                  + QByteArray(QMetaEnum::fromType<MCrypto::MODE>().valueToKey(int(mode)));
}